

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t av1_pixel_diff_dist(MACROBLOCK *x,int plane,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                           BLOCK_SIZE tx_bsize,uint *block_mse_q8)

{
  uint64_t uVar1;
  byte bVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  undefined4 *in_stack_00000008;
  uint64_t sse;
  int16_t *diff;
  int diff_stride;
  MACROBLOCKD *xd;
  int visible_cols;
  int visible_rows;
  BLOCK_SIZE in_stack_ffffffffffffffaf;
  MACROBLOCKD *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe8;
  
  bVar2 = (byte)in_R8D;
  get_txb_dimensions(in_stack_ffffffffffffffc0,in_ESI,(BLOCK_SIZE)((uint)in_EDX >> 0x18),in_ECX,
                     in_R8D,in_stack_ffffffffffffffaf,
                     (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int *)(in_RDI + 0x1a0),
                     (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int *)CONCAT44(in_ECX,CONCAT13(bVar2,CONCAT12(in_R9B,in_stack_ffffffffffffffe8
                                                                   ))));
  uVar1 = (*aom_sum_squares_2d_i16)
                    ((int16_t *)
                     (*(long *)(in_RDI + (long)in_ESI * 0x88) +
                     (long)(int)((in_EDX * (uint)block_size_wide[bVar2] + in_ECX) * 4) * 2),
                     (uint)block_size_wide[bVar2],in_stack_ffffffffffffffe0,
                     in_stack_ffffffffffffffe4);
  if (in_stack_00000008 != (undefined4 *)0x0) {
    if ((in_stack_ffffffffffffffe0 < 1) || (in_stack_ffffffffffffffe4 < 1)) {
      *in_stack_00000008 = 0xffffffff;
    }
    else {
      *in_stack_00000008 =
           (int)((uVar1 << 8) / (ulong)(long)(in_stack_ffffffffffffffe0 * in_stack_ffffffffffffffe4)
                );
    }
  }
  return uVar1;
}

Assistant:

int64_t av1_pixel_diff_dist(const MACROBLOCK *x, int plane, int blk_row,
                            int blk_col, const BLOCK_SIZE plane_bsize,
                            const BLOCK_SIZE tx_bsize,
                            unsigned int *block_mse_q8) {
  int visible_rows, visible_cols;
  const MACROBLOCKD *xd = &x->e_mbd;
  get_txb_dimensions(xd, plane, plane_bsize, blk_row, blk_col, tx_bsize, NULL,
                     NULL, &visible_cols, &visible_rows);
  const int diff_stride = block_size_wide[plane_bsize];
  const int16_t *diff = x->plane[plane].src_diff;

  diff += ((blk_row * diff_stride + blk_col) << MI_SIZE_LOG2);
  uint64_t sse =
      aom_sum_squares_2d_i16(diff, diff_stride, visible_cols, visible_rows);
  if (block_mse_q8 != NULL) {
    if (visible_cols > 0 && visible_rows > 0)
      *block_mse_q8 =
          (unsigned int)((256 * sse) / (visible_cols * visible_rows));
    else
      *block_mse_q8 = UINT_MAX;
  }
  return sse;
}